

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t nblimbs;
  size_t local_30;
  size_t i;
  int ret;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  if (X == Y) {
    X_local._4_4_ = 0;
  }
  else if (Y->p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_mpi_free(X);
    X_local._4_4_ = 0;
  }
  else {
    local_30 = Y->n;
    do {
      nblimbs = local_30;
      local_30 = nblimbs - 1;
      if (local_30 == 0) break;
    } while (Y->p[local_30] == 0);
    X->s = Y->s;
    X_local._4_4_ = mbedtls_mpi_grow(X,nblimbs);
    if (X_local._4_4_ == 0) {
      memset(X->p,0,X->n << 3);
      memcpy(X->p,Y->p,nblimbs * 8);
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret;
    size_t i;

    if( X == Y )
        return( 0 );

    if( Y->p == NULL )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );

    memset( X->p, 0, X->n * ciL );
    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}